

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O0

int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem,uchar *pub,size_t size)

{
  int iVar1;
  uint uVar2;
  bool local_a1;
  undefined1 local_a0 [8];
  secp256k1_fe y;
  secp256k1_fe x_1;
  secp256k1_fe x;
  size_t size_local;
  uchar *pub_local;
  secp256k1_ge *elem_local;
  
  if ((size == 0x21) && ((*pub == '\x02' || (*pub == '\x03')))) {
    iVar1 = secp256k1_fe_set_b32((secp256k1_fe *)(x_1.n + 4),pub + 1);
    local_a1 = false;
    if (iVar1 != 0) {
      iVar1 = secp256k1_ge_set_xo_var(elem,(secp256k1_fe *)(x_1.n + 4),(uint)(*pub == '\x03'));
      local_a1 = iVar1 != 0;
    }
    elem_local._4_4_ = (uint)local_a1;
  }
  else if ((size == 0x41) && (((*pub == '\x04' || (*pub == '\x06')) || (*pub == '\a')))) {
    iVar1 = secp256k1_fe_set_b32((secp256k1_fe *)(y.n + 4),pub + 1);
    if ((iVar1 != 0) &&
       (iVar1 = secp256k1_fe_set_b32((secp256k1_fe *)local_a0,pub + 0x21), iVar1 != 0)) {
      secp256k1_ge_set_xy(elem,(secp256k1_fe *)(y.n + 4),(secp256k1_fe *)local_a0);
      if (((*pub == '\x06') || (*pub == '\a')) &&
         (uVar2 = secp256k1_fe_is_odd((secp256k1_fe *)local_a0), uVar2 != (*pub == '\a'))) {
        return 0;
      }
      iVar1 = secp256k1_ge_is_valid_var(elem);
      return iVar1;
    }
    elem_local._4_4_ = 0;
  }
  else {
    elem_local._4_4_ = 0;
  }
  return elem_local._4_4_;
}

Assistant:

static int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem, const unsigned char *pub, size_t size) {
    if (size == 33 && (pub[0] == SECP256K1_TAG_PUBKEY_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_ODD)) {
        secp256k1_fe x;
        return secp256k1_fe_set_b32(&x, pub+1) && secp256k1_ge_set_xo_var(elem, &x, pub[0] == SECP256K1_TAG_PUBKEY_ODD);
    } else if (size == 65 && (pub[0] == SECP256K1_TAG_PUBKEY_UNCOMPRESSED || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
        secp256k1_fe x, y;
        if (!secp256k1_fe_set_b32(&x, pub+1) || !secp256k1_fe_set_b32(&y, pub+33)) {
            return 0;
        }
        secp256k1_ge_set_xy(elem, &x, &y);
        if ((pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD) &&
            secp256k1_fe_is_odd(&y) != (pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
            return 0;
        }
        return secp256k1_ge_is_valid_var(elem);
    } else {
        return 0;
    }
}